

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackCheck.cpp
# Opt level: O3

Expression * __thiscall
wasm::EnforceStackLimits::stackBoundsCheck
          (EnforceStackLimits *this,Function *func,Expression *value)

{
  char *pcVar1;
  Builder *pBVar2;
  uintptr_t uVar3;
  Type type_;
  Global *pGVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  EnforceStackLimits *pEVar7;
  Index IVar8;
  LocalSet *this_00;
  Expression *pEVar9;
  Binary *this_01;
  Expression *pEVar10;
  Binary *this_02;
  Binary *this_03;
  If *this_04;
  GlobalSet *this_05;
  Block *pBVar11;
  ulong uVar12;
  Type in_R8;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  optional<wasm::Type> type__00;
  Expression *local_a0;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_98;
  char *local_80;
  uintptr_t local_78;
  Call *local_70;
  Builder *local_68;
  char *pcStack_60;
  EnforceStackLimits *local_50;
  Builder *local_48;
  Expression *local_40;
  allocator_type local_35;
  Index local_34;
  
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->stackPointer->type).id;
  local_40 = value;
  IVar8 = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar6 << 0x40),in_R8);
  pcVar1 = (this->handler).super_IString.str._M_str;
  local_34 = IVar8;
  if (pcVar1 == (char *)0x0) {
    local_70 = (Call *)MixedArena::allocSpace(&this->builder->wasm->allocator,0x10,8);
    (local_70->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression._id =
         UnreachableId;
    (local_70->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id = 1;
  }
  else {
    pBVar2 = this->builder;
    local_68 = (Builder *)(this->handler).super_IString.str._M_len;
    uVar3 = (this->stackPointer->type).id;
    local_a0 = (Expression *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x18,8);
    local_a0->_id = LocalGetId;
    *(Index *)(local_a0 + 1) = IVar8;
    (local_a0->type).id = uVar3;
    __l._M_len = 1;
    __l._M_array = &local_a0;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_98,__l,&local_35);
    target.super_IString.str._M_str = pcVar1;
    target.super_IString.str._M_len = (size_t)local_68;
    local_70 = Builder::makeCall(pBVar2,target,&local_98,(Type)(this->stackPointer->type).id,false);
    IVar8 = local_34;
    if (local_98.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      IVar8 = local_34;
    }
  }
  type_.id = (this->stackPointer->type).id;
  if (type_.id < 7) {
    local_68 = this->builder;
    local_48 = (Builder *)CONCAT44(local_48._4_4_,*(undefined4 *)(&DAT_00e1b23c + type_.id * 4));
    this_00 = (LocalSet *)MixedArena::allocSpace(&local_68->wasm->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
    this_00->index = IVar8;
    this_00->value = local_40;
    LocalSet::makeTee(this_00,type_);
    pGVar4 = this->stackBase;
    sVar5 = (pGVar4->super_Importable).super_Named.name.super_IString.str._M_len;
    pcVar1 = (pGVar4->super_Importable).super_Named.name.super_IString.str._M_str;
    local_40 = (Expression *)(pGVar4->type).id;
    local_50 = this;
    pEVar9 = (Expression *)MixedArena::allocSpace(&this->builder->wasm->allocator,0x20,8);
    pEVar7 = local_50;
    pEVar9->_id = GlobalGetId;
    *(size_t *)(pEVar9 + 1) = sVar5;
    pEVar9[1].type.id = (uintptr_t)pcVar1;
    (pEVar9->type).id = (uintptr_t)local_40;
    this_01 = (Binary *)MixedArena::allocSpace(&local_68->wasm->allocator,0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = (BinaryOp)local_48;
    this_01->left = (Expression *)this_00;
    this_01->right = pEVar9;
    Binary::finalize(this_01);
    uVar12 = (pEVar7->stackPointer->type).id;
    if (uVar12 < 7) {
      local_48 = pEVar7->builder;
      local_40 = (Expression *)CONCAT44(local_40._4_4_,*(undefined4 *)(&DAT_00e1b258 + uVar12 * 4));
      pEVar9 = (Expression *)MixedArena::allocSpace(&local_48->wasm->allocator,0x18,8);
      pEVar9->_id = LocalGetId;
      *(Index *)(pEVar9 + 1) = local_34;
      (pEVar9->type).id = uVar12;
      pGVar4 = pEVar7->stackLimit;
      sVar5 = (pGVar4->super_Importable).super_Named.name.super_IString.str._M_len;
      local_80 = (pGVar4->super_Importable).super_Named.name.super_IString.str._M_str;
      local_78 = (pGVar4->type).id;
      pEVar10 = (Expression *)MixedArena::allocSpace(&pEVar7->builder->wasm->allocator,0x20,8);
      pEVar10->_id = GlobalGetId;
      *(size_t *)(pEVar10 + 1) = sVar5;
      pEVar10[1].type.id = (uintptr_t)local_80;
      (pEVar10->type).id = local_78;
      this_02 = (Binary *)MixedArena::allocSpace(&local_48->wasm->allocator,0x28,8);
      (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      this_02->op = (BinaryOp)local_40;
      this_02->left = pEVar9;
      this_02->right = pEVar10;
      Binary::finalize(this_02);
      pBVar2 = local_68;
      this_03 = (Binary *)MixedArena::allocSpace(&local_68->wasm->allocator,0x28,8);
      (this_03->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (this_03->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      this_03->op = OrInt32;
      this_03->left = (Expression *)this_01;
      this_03->right = (Expression *)this_02;
      Binary::finalize(this_03);
      uVar12 = 0x28;
      this_04 = (If *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x28,8);
      (this_04->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
      (this_04->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
      this_04->condition = (Expression *)this_03;
      this_04->ifTrue = (Expression *)local_70;
      this_04->ifFalse = (Expression *)0x0;
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar12;
      If::finalize(this_04,type__00);
      pGVar4 = local_50->stackPointer;
      pBVar2 = local_50->builder;
      local_68 = (Builder *)(pGVar4->super_Importable).super_Named.name.super_IString.str._M_len;
      pcStack_60 = (pGVar4->super_Importable).super_Named.name.super_IString.str._M_str;
      uVar3 = (pGVar4->type).id;
      pEVar9 = (Expression *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x18,8);
      pEVar9->_id = LocalGetId;
      *(Index *)(pEVar9 + 1) = local_34;
      (pEVar9->type).id = uVar3;
      this_05 = (GlobalSet *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x28,8);
      (this_05->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
           GlobalSetId;
      (this_05->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
      (this_05->name).super_IString.str._M_len = (size_t)local_68;
      (this_05->name).super_IString.str._M_str = pcStack_60;
      this_05->value = pEVar9;
      GlobalSet::finalize(this_05);
      pBVar11 = Builder::blockify(local_50->builder,(Expression *)this_04,(Expression *)this_05);
      return (Expression *)pBVar11;
    }
  }
  __assert_fail("isBasic() && \"Basic type expected\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x1c4,"BasicType wasm::Type::getBasic() const");
}

Assistant:

Expression* stackBoundsCheck(Function* func, Expression* value) {
    // Add a local to store the value of the expression. We need the value
    // twice: once to check if it has overflowed, and again to assign to store
    // it.
    auto newSP = Builder::addVar(func, stackPointer->type);
    // If we imported a handler, call it. That can show a nice error in JS.
    // Otherwise, just trap.
    Expression* handlerExpr;
    if (handler.is()) {
      handlerExpr =
        builder.makeCall(handler,
                         {builder.makeLocalGet(newSP, stackPointer->type)},
                         stackPointer->type);
    } else {
      handlerExpr = builder.makeUnreachable();
    }

    // If it is >= the base or <= the limit, then error.
    auto check = builder.makeIf(
      builder.makeBinary(
        BinaryOp::OrInt32,
        builder.makeBinary(
          Abstract::getBinary(stackPointer->type, Abstract::GtU),
          builder.makeLocalTee(newSP, value, stackPointer->type),
          builder.makeGlobalGet(stackBase->name, stackBase->type)),
        builder.makeBinary(
          Abstract::getBinary(stackPointer->type, Abstract::LtU),
          builder.makeLocalGet(newSP, stackPointer->type),
          builder.makeGlobalGet(stackLimit->name, stackLimit->type))),
      handlerExpr);
    // (global.set $__stack_pointer (local.get $newSP))
    auto newSet = builder.makeGlobalSet(
      stackPointer->name, builder.makeLocalGet(newSP, stackPointer->type));
    return builder.blockify(check, newSet);
  }